

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

bool __thiscall
duckdb::CatalogSet::CreateEntryInternal
          (CatalogSet *this,CatalogTransaction transaction,string *name,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *value,
          unique_lock<std::mutex> *read_lock,bool should_be_empty)

{
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var1;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  bool bVar2;
  CatalogEntry *entry;
  DuckTransactionManager *this_00;
  Transaction *transaction_p;
  type entry_00;
  CatalogSet *this_01;
  optional_ptr<duckdb::CatalogEntry,_true> entry_value;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_70;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *local_68;
  optional_ptr<duckdb::CatalogEntry,_true> local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_68 = value;
  local_60 = CatalogEntryMap::GetEntry(&this->map,name);
  if (local_60.ptr == (CatalogEntry *)0x0) {
    transaction_01.context.ptr = transaction.context.ptr;
    transaction_01.db.ptr = transaction.db.ptr;
    transaction_01.transaction.ptr = transaction.transaction.ptr;
    transaction_01.transaction_id = transaction.transaction_id;
    transaction_01.start_time = transaction.start_time;
    bVar2 = StartChain(this,transaction_01,name,read_lock);
  }
  else {
    if (!should_be_empty) goto LAB_0160bf88;
    local_38 = transaction.start_time;
    local_48 = transaction.transaction.ptr;
    uStack_40 = transaction.transaction_id;
    local_58 = transaction.db.ptr;
    uStack_50 = transaction.context.ptr;
    this_01 = (CatalogSet *)&stack0xffffffffffffffa0;
    entry = optional_ptr<duckdb::CatalogEntry,_true>::operator*
                      ((optional_ptr<duckdb::CatalogEntry,_true> *)this_01);
    transaction_00.context.ptr = (ClientContext *)uStack_50;
    transaction_00.db.ptr = (DatabaseInstance *)local_58;
    transaction_00.transaction.ptr = (Transaction *)local_48;
    transaction_00.transaction_id = uStack_40;
    transaction_00.start_time = local_38;
    bVar2 = VerifyVacancy(this_01,transaction_00,entry);
  }
  if (bVar2 == false) {
    return false;
  }
LAB_0160bf88:
  _Var1._M_head_impl =
       (local_68->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  (local_68->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>).
  _M_t.super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = (CatalogEntry *)0x0;
  local_70._M_head_impl = _Var1._M_head_impl;
  CatalogEntryMap::UpdateEntry
            (&this->map,
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
             &local_70);
  if (local_70._M_head_impl != (CatalogEntry *)0x0) {
    (*(local_70._M_head_impl)->_vptr_CatalogEntry[1])();
  }
  local_70._M_head_impl = (CatalogEntry *)0x0;
  if (transaction.transaction.ptr != (Transaction *)0x0) {
    this_00 = DuckTransactionManager::Get((this->catalog->super_Catalog).db);
    transaction_p = optional_ptr<duckdb::Transaction,_true>::operator*(&transaction.transaction);
    entry_00 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
               operator*(&(_Var1._M_head_impl)->child);
    DuckTransactionManager::PushCatalogEntry(this_00,transaction_p,entry_00,(data_ptr_t)0x0,0);
  }
  return true;
}

Assistant:

bool CatalogSet::CreateEntryInternal(CatalogTransaction transaction, const string &name, unique_ptr<CatalogEntry> value,
                                     unique_lock<mutex> &read_lock, bool should_be_empty) {
	auto entry_value = map.GetEntry(name);
	if (!entry_value) {
		// Add a dummy node to start the chain
		if (!StartChain(transaction, name, read_lock)) {
			return false;
		}
	} else if (should_be_empty) {
		// Verify that the entry is deleted, not altered by another transaction
		if (!VerifyVacancy(transaction, *entry_value)) {
			return false;
		}
	}

	// Finally add the new entry to the chain
	auto value_ptr = value.get();
	map.UpdateEntry(std::move(value));
	// Push the old entry in the undo buffer for this transaction, so it can be restored in the event of failure
	if (transaction.transaction) {
		DuckTransactionManager::Get(GetCatalog().GetAttached())
		    .PushCatalogEntry(*transaction.transaction, value_ptr->Child());
	}
	return true;
}